

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::ExternalCallEventLogEntry_Emit
               (EventLogEntry *evt,FileWriter *writer,ThreadContext *threadContext)

{
  int64 val;
  ulong uVar1;
  
  if (evt->EventKind == ExternalCallTag) {
    FileWriter::WriteString(writer,name,(TTString *)(evt + 4),CommaSeparator);
    FileWriter::WriteInt32(writer,rootNestingDepth,evt[1].EventKind,CommaSeparator);
    FileWriter::WriteLengthValue(writer,evt[1].ResultStatus,CommaSeparator);
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    if (evt[1].ResultStatus != 0) {
      uVar1 = 0;
      do {
        NSSnapValues::EmitTTDVar(*(TTDVar *)(evt[1].EventTimeStamp + uVar1 * 8),writer,uVar1 != 0);
        uVar1 = uVar1 + 1;
      } while (uVar1 < (uint)evt[1].ResultStatus);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    (*writer->_vptr_FileWriter[3])(writer,0x13,1);
    NSSnapValues::EmitTTDVar(*(TTDVar *)(evt + 2),writer,NoSeparator);
    (*writer->_vptr_FileWriter[3])(writer,0x12,1);
    NSSnapValues::EmitTTDVar((TTDVar)evt[2].EventTimeStamp,writer,NoSeparator);
    (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(byte)evt[3].EventTimeStamp,1);
    val._0_4_ = evt[3].EventKind;
    val._4_4_ = evt[3].ResultStatus;
    FileWriter::WriteInt64(writer,i64Val,val,CommaSeparator);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void ExternalCallEventLogEntry_Emit(const EventLogEntry* evt, FileWriter* writer, ThreadContext* threadContext)
        {
            const ExternalCallEventLogEntry* callEvt = GetInlineEventDataAs<ExternalCallEventLogEntry, EventKind::ExternalCallTag>(evt);

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            writer->WriteString(NSTokens::Key::name, callEvt->FunctionName, NSTokens::Separator::CommaSeparator);
#endif

            writer->WriteInt32(NSTokens::Key::rootNestingDepth, callEvt->RootNestingDepth, NSTokens::Separator::CommaSeparator);

            writer->WriteLengthValue(callEvt->ArgCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < callEvt->ArgCount; ++i)
            {
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;
                NSSnapValues::EmitTTDVar(callEvt->ArgArray[i], writer, sep);
            }
            writer->WriteSequenceEnd();

            writer->WriteKey(NSTokens::Key::newTargetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(callEvt->NewTarget, writer, NSTokens::Separator::NoSeparator);

            writer->WriteKey(NSTokens::Key::argRetVal, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(callEvt->ReturnValue, writer, NSTokens::Separator::NoSeparator);

            writer->WriteBool(NSTokens::Key::boolVal, callEvt->CheckExceptionStatus, NSTokens::Separator::CommaSeparator);

            writer->WriteInt64(NSTokens::Key::i64Val, callEvt->LastNestedEventTime, NSTokens::Separator::CommaSeparator);
        }